

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmatmultc.c
# Opt level: O3

int main(int argc,char **argv)

{
  char ta;
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int g_a;
  int handle;
  int handle_00;
  int iVar6;
  int iVar7;
  Boolean BVar8;
  double *f;
  double *tmpb;
  double *tmpa;
  double *tmpc;
  bool bVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int dims [2];
  int argc_local;
  double avg_mf [4];
  double avg_t [4];
  char **argv_local;
  
  argc_local = argc;
  argv_local = argv;
  MPI_Init(&argc_local,&argv_local);
  BVar8 = MA_init(0x3ec,1,20000000);
  if (BVar8 == 0) {
    GA_Error("failed: ma_init(MT_DBL,1,20000000)",10);
  }
  GA_Initialize();
  iVar5 = GA_Nodeid();
  f = (double *)malloc(0x800000);
  tmpb = (double *)malloc(0x800000);
  tmpa = (double *)malloc(0x800000);
  tmpc = (double *)malloc(0x800000);
  lVar10 = 0;
  iVar7 = 0;
  do {
    bVar1 = 0x3ff < iVar7;
    iVar7 = iVar7 + 1;
    if (bVar1) {
      iVar7 = 0;
    }
    f[lVar10] = (double)iVar7;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x100000);
  lVar10 = 0;
  bVar1 = true;
  do {
    bVar9 = bVar1;
    iVar7 = (&DAT_001b1020)[lVar10];
    dims[0] = iVar7;
    dims[1] = iVar7;
    g_a = NGA_Create(0x3ec,2,dims,"g_c",(int *)0x0);
    if (g_a == 0) {
      GA_Error("failed: create g_c",0x14);
    }
    dims[0] = iVar7;
    dims[1] = iVar7;
    handle = NGA_Create(0x3ec,2,dims,"g_b",(int *)0x0);
    if (handle == 0) {
      GA_Error("failed: create g_b",0x1e);
    }
    dims[0] = iVar7;
    dims[1] = iVar7;
    handle_00 = NGA_Create(0x3ec,2,dims,"g_a",(int *)0x0);
    if (handle_00 == 0) {
      GA_Error("failed: create g_a",0x28);
    }
    if (iVar5 == 0) {
      load_ga(handle_00,f,iVar7,iVar7);
      load_ga(handle,f,iVar7,iVar7);
    }
    GA_Zero(g_a);
    GA_Sync();
    iVar6 = GA_Nodeid();
    if (iVar6 == 0) {
      lVar10 = (long)iVar7;
      printf("\nMatrix Multiplication on C = A[%ld,%ld]xB[%ld,%ld]\n",lVar10,lVar10,lVar10,lVar10);
      fflush(_stdout);
    }
    avg_t[2] = 0.0;
    avg_t[3] = 0.0;
    avg_t[0] = 0.0;
    avg_t[1] = 0.0;
    avg_mf[0] = 0.0;
    avg_mf[1] = 0.0;
    avg_mf[2] = 0.0;
    avg_mf[3] = 0.0;
    dVar4 = (double)iVar7;
    uVar12 = 0;
    do {
      lVar10 = 0;
      do {
        GA_Sync();
        ta = (&DAT_001b1050)[lVar10];
        dVar2 = (double)MPI_Wtime();
        GA_Dgemm(ta,ta,iVar7,iVar7,iVar7,1.0,handle_00,handle,0.0,g_a);
        dVar3 = (double)MPI_Wtime();
        if (iVar5 == 0) {
          iVar6 = GA_Nnodes();
          avg_t[lVar10] = avg_t[lVar10] + (dVar3 - dVar2);
          avg_mf[lVar10] =
               avg_mf[lVar10] +
               ((((dVar4 + dVar4) * dVar4 * dVar4) / (dVar3 - dVar2)) * 1e-06) / (double)iVar6;
          printf("%15s%2d: %12.4f seconds %12.1f mflops/proc  %c %c\n","Run#",uVar12,
                 (ulong)(uint)(int)ta);
          fflush(_stdout);
          if ((int)uVar12 == 0) {
            verify_ga_dgemm(ta,ta,iVar7,iVar7,iVar7,1.0,handle,handle_00,0.0,g_a,tmpa,tmpb,tmpc);
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar11 != 5);
    iVar7 = GA_Nodeid();
    if (iVar7 == 0) {
      putchar(10);
      lVar10 = 0;
      do {
        printf("%17s: %12.4f seconds %12.1f mflops/proc  %c %c\n",SUB84(avg_t[lVar10] / 5.0,0),
               avg_mf[lVar10] / 5.0,"Average",(ulong)(uint)(int)(char)(&DAT_001b1050)[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      puts("All GA_Dgemms are verified...O.K.");
      fflush(_stdout);
    }
    GA_Destroy(g_a);
    GA_Destroy(handle);
    GA_Destroy(handle_00);
    lVar10 = 1;
    bVar1 = false;
  } while (bVar9);
  iVar7 = GA_Nodeid();
  if (iVar7 == 0) {
    puts("All tests successful");
  }
  free(f);
  free(tmpb);
  free(tmpa);
  free(tmpc);
  GA_Terminate();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int num_m;
    int num_n;
    int num_k;
    int i;
    int ii;
    double *h0;
    int g_c;
    int g_b;
    int g_a;
    double a;
    double t1;
    double mf;
    double avg_t[ntrans];
    double avg_mf[ntrans];
    int itime;
    int ntimes;
    int me;
    int nums_m[/*howmany*/] = {512,1024};
    int nums_n[/*howmany*/] = {512,1024};
    int nums_k[/*howmany*/] = {512,1024};
    char transa[/*ntrans*/] = "nnnn";
    char transb[/*ntrans*/] = "nnnn";
    char ta;
    char tb;
    double *tmpa;
    double *tmpb;
    double *tmpc;
    int ndim;
    int dims[2];
#ifdef BLOCK_CYCLIC
    int block_size[2];
#endif

    MP_INIT(argc,argv);
    if (!MA_init(MT_DBL,1,20000000)) {
        GA_Error("failed: ma_init(MT_DBL,1,20000000)",10);
    }
    GA_INIT(argc,argv);
    me = GA_Nodeid();

    h0 = (double*)malloc(sizeof(double) * nummax*nummax);
    tmpa = (double*)malloc(sizeof(double) * nummax*nummax);
    tmpb = (double*)malloc(sizeof(double) * nummax*nummax);
    tmpc = (double*)malloc(sizeof(double) * nummax*nummax);

    ii = 0;
    for (i=0; i<nummax*nummax; i++) {
        ii = ii + 1;
        if (ii > nummax) {
            ii = 0;
        }
        h0[i] = ii;
    }

    /* Compute times assuming 500 mflops and 5 second target time */
    /* ntimes = max(3.0d0,5.0d0/(4.0d-9*num**3)); */
    ntimes = 5;

    for (ii=0; ii<howmany; ii++) {
        num_m = nums_m[ii];
        num_n = nums_n[ii];
        num_k = nums_k[ii];
        a = 0.5/(num_m*num_n);
        if (num_m > nummax || num_n > nummax || num_k > nummax) {
            GA_Error("Insufficient memory: check nummax", 1);
        }

#ifndef BLOCK_CYCLIC
        ndim = 2;

        dims[0] = num_m;
        dims[1] = num_n;
        if (!((g_c = NGA_Create(MT_DBL,ndim,dims,"g_c",NULL)))) {
            GA_Error("failed: create g_c",20);
        }

        dims[0] = num_k;
        dims[1] = num_n;
        if (!((g_b = NGA_Create(MT_DBL,ndim,dims,"g_b",NULL)))) {
            GA_Error("failed: create g_b",30);
        }

        dims[0] = num_m;
        dims[1] = num_k;
        if (!((g_a = NGA_Create(MT_DBL,ndim,dims,"g_a",NULL)))) {
            GA_Error("failed: create g_a",40);
        }
#else
        ndim = 2;
        block_size[0] = 128;
        block_size[1] = 128;

        dims[0] = num_m;
        dims[1] = num_n;
        g_c = GA_Create_handle();
        GA_Set_data(g_c,ndim,dims,MT_DBL);
        GA_Set_array_name(g_c,"g_c");
        GA_Set_block_cyclic(g_c,block_size);
        if (!GA_Allocate(g_c)) {
            GA_Error("failed: create g_c",40);
        }

        dims[0] = num_k;
        dims[1] = num_n;
        g_b = GA_Create_handle();
        GA_Set_data(g_b,ndim,dims,MT_DBL);
        GA_Set_array_name(g_b,"g_b");
        GA_Set_block_cyclic(g_b,block_size);
        if (!GA_Allocate(g_b)) {
            GA_Error("failed: create g_b",40);
        }

        dims[0] = num_m;
        dims[1] = num_k;
        g_a = GA_Create_handle();
        GA_Set_data(g_a,ndim,dims,MT_DBL);
        GA_Set_array_name(g_a,"g_a");
        GA_Set_block_cyclic(g_a,block_size);
        if (!GA_Allocate(g_a)) {
            GA_Error("failed: create g_a",40);
        }
#endif         

        /* Initialize matrices A and B */
        if (me == 0) { 
            load_ga(g_a, h0, num_m, num_k);
            load_ga(g_b, h0, num_k, num_n);
        }
        GA_Zero(g_c);
        GA_Sync();

        if (GA_Nodeid() == 0) {
            printf("\nMatrix Multiplication on C = A[%ld,%ld]xB[%ld,%ld]\n",
                    (long)num_m, (long)num_k, (long)num_k, (long)num_n);
            fflush(stdout);
        }

        for (i=0; i<ntrans; i++) {
            avg_t[i]  = 0.0;
            avg_mf[i] = 0.0;
        }

        for (itime=0; itime<ntimes; itime++) {
            for (i=0; i<ntrans; i++) {
                GA_Sync();
                ta = transa[i];
                tb = transb[i];
                t1 = MP_TIMER();
                GA_Dgemm(ta,tb,num_m,num_n,num_k,1.0, g_a, g_b, 0.0, g_c);
                t1 = MP_TIMER() - t1;
                if (me == 0) {
                    mf = 2e0*num_m*num_n*num_k/t1*1e-6/GA_Nnodes();
                    avg_t[i]  = avg_t[i]+t1;
                    avg_mf[i] = avg_mf[i] + mf;
                    printf("%15s%2d: %12.4f seconds %12.1f mflops/proc  %c %c\n",
                            "Run#", itime, t1, mf, ta, tb);
                    fflush(stdout);
                    if (dgemm_verify && itime == 0) {
                        /* recall the C API swaps the matrix order */
                        /* we swap it here for the Fortran-based verify */
                        verify_ga_dgemm(tb, ta, num_n, num_m, num_k, 1.0,
                                g_b, g_a, 0.0, g_c, tmpb, tmpa, tmpc);
                    }
                }
            }
        }

        if (GA_Nodeid() == 0) {
            printf("\n");
            for (i=0; i<ntrans; i++) {
                printf("%17s: %12.4f seconds %12.1f mflops/proc  %c %c\n",
                        "Average", avg_t[i]/ntimes, avg_mf[i]/ntimes,
                        transa[i], transb[i]);
            }
            if(dgemm_verify) {
                printf("All GA_Dgemms are verified...O.K.\n");
            }
            fflush(stdout);
        }

        /*
           GA_Print(g_a);
           GA_Print(g_b);
           GA_Print(g_c);
           */

        GA_Destroy(g_c);
        GA_Destroy(g_b);
        GA_Destroy(g_a);
    }

    /* ???
       format(a15, i2, ': ', e12.4, ' seconds ',f12.1, 
       .     ' mflops/proc ', 3a2)
       */
    if (GA_Nodeid() == 0) {
        printf("All tests successful\n");
    }

    free(h0);
    free(tmpa);
    free(tmpb);
    free(tmpc);

    GA_Terminate();
    MP_FINALIZE();
    return 0;
}